

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~ValueFlag(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  ~ValueFlag(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ValueFlag() {}